

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O1

void __thiscall
rcdiscover::SocketLinux::sendImpl
          (SocketLinux *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sendbuf)

{
  int iVar1;
  pointer __buf;
  ssize_t sVar2;
  int *piVar3;
  SocketException *this_00;
  string local_40;
  
  __buf = (sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
  sVar2 = sendto(this->sock_,__buf,
                 (long)(sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)__buf,0,
                 (sockaddr *)&this->dst_addr_,0x10);
  if (sVar2 != -1) {
    return;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  this_00 = (SocketException *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  if (iVar1 == 0x65) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Error while sending data - network unreachable","");
    NetworkUnreachableException::NetworkUnreachableException
              ((NetworkUnreachableException *)this_00,&local_40,*piVar3);
    __cxa_throw(this_00,&NetworkUnreachableException::typeinfo,SocketException::~SocketException);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Error while sending data","")
  ;
  SocketException::SocketException(this_00,&local_40,*piVar3);
  __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::sendImpl(const std::vector<uint8_t>& sendbuf)
{
  if (::sendto(sock_,
              static_cast<const void *>(sendbuf.data()),
              sendbuf.size(),
              0,
              reinterpret_cast<const sockaddr *>(&dst_addr_),
              static_cast<socklen_t>(sizeof(sockaddr_in))) == -1)
   {
     if (errno == ENETUNREACH)
     {
       throw NetworkUnreachableException(
             "Error while sending data - network unreachable", errno);
     }

     throw SocketException("Error while sending data", errno);
   }
}